

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O2

bool export_scene_anim_as_obj
               (ogt_vox_scene *scene,string *out_name,bool out_file_per_frame,float voxel_scale,
               uint32_t frame_min,uint32_t frame_max,char *mesh_algorithm)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  uint uVar5;
  uint uVar6;
  ogt_vox_model *poVar7;
  ogt_mesh_vertex *poVar8;
  uint32_t *puVar9;
  uint32_t i;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  FILE *pFVar14;
  ogt_mesh *poVar15;
  uint8_t *puVar16;
  ulong uVar17;
  bool bVar18;
  ogt_vox_instance *instance;
  uint32_t value;
  _Alloc_hider _Var19;
  uint uVar20;
  size_t i_3;
  size_t i_5;
  ogt_mesh_vec3 oVar21;
  byte local_860;
  uint32_t frame_max_local;
  uint32_t frame_min_local;
  ulong local_830;
  vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> meshes;
  string local_7f8;
  ogt_voxel_meshify_context meshify_context;
  string out_material_name;
  string out_texture_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  uint8_t tga_data [768];
  ogt_vox_palette palette;
  
  frame_max_local = frame_max;
  frame_min_local = frame_min;
  get_frame_min_max(scene,&frame_min_local,&frame_max_local);
  memcpy(&palette,&scene->palette,0x400);
  for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
    palette.color[lVar13].a = (uint8_t)lVar13;
  }
  meshify_context.alloc_free_user_data = (void *)0x0;
  meshify_context.alloc_func = (ogt_voxel_meshify_alloc_func)0x0;
  meshify_context.free_func = (ogt_voxel_meshify_free_func)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  tga_data[0] = '\0';
  tga_data[1] = '\0';
  tga_data[2] = '\0';
  tga_data[3] = '\0';
  tga_data[4] = '\0';
  tga_data[5] = '\0';
  tga_data[6] = '\0';
  tga_data[7] = '\0';
  std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::resize
            (&meshes,(ulong)scene->num_models,(value_type *)tga_data);
  std::operator+(&out_texture_name,out_name,".tga");
  std::operator+(&out_material_name,out_name,".mtl");
  pFVar14 = fopen(out_texture_name._M_dataplus._M_p,"wb");
  _Var19 = out_texture_name._M_dataplus;
  if (pFVar14 != (FILE *)0x0) {
    printf("writing file %s\n",out_texture_name._M_dataplus._M_p);
    puVar16 = &palette.color[0].b;
    for (lVar13 = 2; lVar13 != 0x302; lVar13 = lVar13 + 3) {
      tga_data[lVar13 + -2] = ((ogt_vox_rgba *)(puVar16 + -2))->r;
      tga_data[lVar13 + -1] = puVar16[-1];
      tga_data[lVar13] = *puVar16;
      puVar16 = puVar16 + 4;
    }
    write_tga_24bit(tga_data,0x100,1,(FILE *)pFVar14);
    fclose(pFVar14);
    pFVar14 = fopen(out_material_name._M_dataplus._M_p,"wb");
    _Var19 = out_material_name._M_dataplus;
    if (pFVar14 != (FILE *)0x0) {
      printf("writing file %s\n",out_material_name._M_dataplus._M_p);
      fwrite("# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"
             ,0x7b,1,pFVar14);
      fwrite("\r\n",2,1,pFVar14);
      fwrite("newmtl palette\r\n",0x10,1,pFVar14);
      fwrite("illum 1\r\n",9,1,pFVar14);
      fwrite("Ka 0.000 0.000 0.000\r\n",0x16,1,pFVar14);
      fwrite("Kd 1.000 1.000 1.000\r\n",0x16,1,pFVar14);
      fwrite("Ks 0.000 0.000 0.000\r\n",0x16,1,pFVar14);
      fprintf(pFVar14,"map_Kd %s\r\n",out_texture_name._M_dataplus._M_p);
      fclose(pFVar14);
      iVar12 = 0;
      pFVar14 = (FILE *)0x0;
      local_860 = 0;
      value = frame_min_local;
      while( true ) {
        if (frame_max_local < value) break;
        if (out_file_per_frame) {
          if (pFVar14 != (FILE *)0x0) {
            fclose(pFVar14);
          }
          std::operator+(&local_778,out_name,"-");
          zero_padded_string_abi_cxx11_(&local_7f8,value,3);
          std::operator+(&local_758,&local_778,&local_7f8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         tga_data,&local_758,".obj");
          std::__cxx11::string::~string((string *)&local_758);
          std::__cxx11::string::~string((string *)&local_7f8);
          std::__cxx11::string::~string((string *)&local_778);
          pFVar14 = (FILE *)open_obj_file((char *)tga_data._0_8_);
          iVar11 = 0;
          if (pFVar14 == (FILE *)0x0) {
            printf("could not open file \'%s\' for write - aborting!",tga_data._0_8_);
            local_860 = 1;
            iVar11 = iVar12;
          }
          std::__cxx11::string::~string((string *)tga_data);
          iVar12 = iVar11;
joined_r0x0010e81f:
          if (pFVar14 == (FILE *)0x0) goto LAB_0010eca8;
        }
        else if (pFVar14 == (FILE *)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         tga_data,out_name,".obj");
          pFVar14 = (FILE *)open_obj_file((char *)tga_data._0_8_);
          if (pFVar14 == (FILE *)0x0) {
            printf("could not open file \'%s\' for write - aborting!",tga_data._0_8_);
            local_860 = 1;
          }
          std::__cxx11::string::~string((string *)tga_data);
          goto joined_r0x0010e81f;
        }
        fprintf(pFVar14,"o frame_%03u\n",(ulong)value);
        fprintf(pFVar14,"mtllib %s\n",out_material_name._M_dataplus._M_p);
        fwrite("usemtl palette\n",0xf,1,pFVar14);
        for (uVar17 = 0; uVar17 < scene->num_instances; uVar17 = uVar17 + 1) {
          if (((scene->instances[uVar17].hidden == false) &&
              (instance = scene->instances + uVar17,
              scene->layers[instance->layer_index].hidden == false)) &&
             (((ulong)instance->group_index == 0xffffffff ||
              (scene->groups[instance->group_index].hidden == false)))) {
            local_830 = uVar17;
            ogt_vox_sample_instance_transform_global
                      ((ogt_vox_transform *)tga_data,instance,value,scene);
            uVar10 = ogt_vox_sample_instance_model(instance,value);
            poVar7 = scene->models[uVar10];
            if ((poVar7 != (ogt_vox_model *)0x0) &&
               (meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] == (ogt_mesh *)0x0)) {
              printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n",
                     (ulong)poVar7->size_x,(ulong)poVar7->size_y,(ulong)poVar7->size_z,
                     mesh_algorithm);
              iVar11 = strcmp(mesh_algorithm,"polygon");
              if (iVar11 == 0) {
                poVar15 = ogt_mesh_from_paletted_voxels_polygon
                                    (&meshify_context,poVar7->voxel_data,poVar7->size_x,
                                     poVar7->size_y,poVar7->size_z,(ogt_mesh_rgba *)&palette);
              }
              else {
                iVar11 = strcmp(mesh_algorithm,"greedy");
                if (iVar11 == 0) {
                  poVar15 = ogt_mesh_from_paletted_voxels_greedy
                                      (&meshify_context,poVar7->voxel_data,poVar7->size_x,
                                       poVar7->size_y,poVar7->size_z,(ogt_mesh_rgba *)&palette);
                }
                else {
                  iVar11 = strcmp(mesh_algorithm,"simple");
                  if (iVar11 == 0) {
                    poVar15 = ogt_mesh_from_paletted_voxels_simple
                                        (&meshify_context,poVar7->voxel_data,poVar7->size_x,
                                         poVar7->size_y,poVar7->size_z,(ogt_mesh_rgba *)&palette);
                  }
                  else {
                    poVar15 = (ogt_mesh *)0x0;
                  }
                }
              }
              lVar13 = 0;
              for (uVar17 = 0; uVar17 < poVar15->vertex_count; uVar17 = uVar17 + 1) {
                poVar8 = poVar15->vertices;
                uVar2 = poVar7->size_x;
                uVar4 = poVar7->size_y;
                uVar3 = *(undefined8 *)((long)&(poVar8->pos).x + lVar13);
                *(ulong *)((long)&(poVar8->pos).x + lVar13) =
                     CONCAT44((float)((ulong)uVar3 >> 0x20) - (float)((uint)uVar4 >> 1),
                              (float)uVar3 - (float)((uint)uVar2 >> 1));
                *(float *)((long)&(poVar8->pos).z + lVar13) =
                     *(float *)((long)&(poVar8->pos).z + lVar13) - (float)(poVar7->size_z >> 1);
                fVar1 = *(float *)((long)&(poVar8->normal).x + lVar13);
                if ((fVar1 != 0.0) || (NAN(fVar1))) {
                  uVar20 = (uint)(fVar1 <= 0.0);
                }
                else {
                  fVar1 = *(float *)((long)&(poVar8->normal).y + lVar13);
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    uVar20 = 0.0 < fVar1 ^ 3;
                  }
                  else {
                    uVar20 = 0.0 < *(float *)((long)&(poVar8->normal).z + lVar13) ^ 5;
                  }
                }
                *(uint *)((long)&(poVar8->normal).x + lVar13) = uVar20;
                lVar13 = lVar13 + 0x20;
              }
              meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = poVar15;
            }
            poVar15 = meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
            uVar17 = local_830;
            if (poVar15 != (ogt_mesh *)0x0) {
              if ((voxel_scale != 1.0) || (NAN(voxel_scale))) {
                for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
                  *(float *)(tga_data + lVar13 * 4) =
                       *(float *)(tga_data + lVar13 * 4) * voxel_scale;
                }
                lVar13 = 0;
                for (uVar17 = 0; uVar17 < poVar15->vertex_count; uVar17 = uVar17 + 1) {
                  transform_point((ogt_vox_transform *)tga_data,
                                  (ogt_mesh_vec3 *)((long)&(poVar15->vertices->pos).x + lVar13));
                  fprintf(pFVar14,"v %f %f %f\n");
                  lVar13 = lVar13 + 0x20;
                }
              }
              else {
                lVar13 = 0;
                for (uVar17 = 0; uVar17 < poVar15->vertex_count; uVar17 = uVar17 + 1) {
                  oVar21 = transform_point((ogt_vox_transform *)tga_data,
                                           (ogt_mesh_vec3 *)
                                           ((long)&(poVar15->vertices->pos).x + lVar13));
                  fprintf(pFVar14,"v %i %i %i\n",(ulong)(uint)(int)oVar21.x,
                          (ulong)(uint)(int)oVar21.y,(ulong)(uint)(int)oVar21.z);
                  lVar13 = lVar13 + 0x20;
                }
              }
              iVar11 = iVar12 + 1;
              for (uVar17 = 0; uVar17 < poVar15->index_count; uVar17 = uVar17 + 3) {
                poVar8 = poVar15->vertices;
                puVar9 = poVar15->indices;
                uVar20 = puVar9[uVar17];
                uVar5 = puVar9[uVar17 + 1];
                uVar6 = puVar9[uVar17 + 2];
                fprintf(pFVar14,"f %u/%u/%u %u/%u/%u %u/%u/%u\n",(ulong)(uVar20 + iVar11),
                        (ulong)(poVar8[uVar20].color.a + 1),
                        (ulong)((int)poVar8[uVar20].normal.x + 1),(ulong)(uVar5 + iVar11),
                        (ulong)(poVar8[uVar5].color.a + 1),(ulong)((int)poVar8[uVar5].normal.x + 1),
                        (ulong)(uVar6 + iVar11),(ulong)(poVar8[uVar6].color.a + 1),
                        (ulong)((int)poVar8[uVar6].normal.x + 1));
              }
              iVar12 = iVar12 + poVar15->vertex_count;
              uVar17 = local_830;
            }
          }
        }
        value = value + 1;
      }
      if (pFVar14 != (FILE *)0x0) {
        fclose(pFVar14);
      }
LAB_0010eca8:
      bVar18 = (bool)(local_860 ^ 1);
      goto LAB_0010ecc2;
    }
  }
  bVar18 = false;
  printf("could not open file \'%s\' for write - aborting!",_Var19._M_p);
LAB_0010ecc2:
  std::__cxx11::string::~string((string *)&out_material_name);
  std::__cxx11::string::~string((string *)&out_texture_name);
  std::_Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::~_Vector_base
            (&meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>);
  return bVar18;
}

Assistant:

bool export_scene_anim_as_obj(const ogt_vox_scene* scene, const std::string& out_name, bool out_file_per_frame, float voxel_scale, uint32_t frame_min, uint32_t frame_max, const char* mesh_algorithm) {
    get_frame_min_max(scene, frame_min, frame_max);

    // put the color index into the alpha component of every color in the palette
    ogt_vox_palette palette = scene->palette;
    for (uint32_t i = 0; i < 256; i++) {
        palette.color[i].a = (uint8_t)i;
    }

    // meshify all models.
    ogt_voxel_meshify_context meshify_context = {};
    std::vector<ogt_mesh*> meshes;
    meshes.resize(scene->num_models, nullptr);

    // go through all frames
    std::string out_texture_name = out_name + ".tga";
    std::string out_material_name = out_name + ".mtl";

    // write palette data as tga
    {
        FILE* fout = open_file(out_texture_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_texture_name.c_str());
            return false;
        }

        printf("writing file %s\n", out_texture_name.c_str());
        uint8_t tga_data[256*3];
        for (uint32_t j = 0; j < 256; j++) {
            tga_data[j * 3 + 0] = palette.color[j].r;
            tga_data[j * 3 + 1] = palette.color[j].g;
            tga_data[j * 3 + 2] = palette.color[j].b;
        }
        write_tga_24bit(tga_data, 256, 1, fout);
        fclose(fout);
    }

    // write material data
    {
        FILE* fout = open_file(out_material_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_material_name.c_str());
            return false;
        }
        printf("writing file %s\n", out_material_name.c_str());
        fprintf(fout, "# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"); // TODO(jpaver) proper header
        fprintf(fout, "\r\n");
        fprintf(fout, "newmtl palette\r\n");
        fprintf(fout, "illum 1\r\n");
        fprintf(fout, "Ka 0.000 0.000 0.000\r\n");
        fprintf(fout, "Kd 1.000 1.000 1.000\r\n");
        fprintf(fout, "Ks 0.000 0.000 0.000\r\n");
        fprintf(fout, "map_Kd %s\r\n", out_texture_name.c_str());
        fclose(fout);
    }

    // write geometry data
    bool error = false;
    {
        FILE* fout = nullptr;
        uint32_t base_vertex_index = 0;
        for (uint32_t frame_index = frame_min; frame_index <= frame_max; frame_index++) {
            if (out_file_per_frame) {
                if (fout)
                    fclose(fout);
                std::string out_obj_name = out_name + "-" + zero_padded_string(frame_index, 3) + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
                base_vertex_index = 0;
            }
            else if (!fout) {
                std::string out_obj_name = out_name + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
            }

            fprintf(fout, "o frame_%03u\n", frame_index);
            fprintf(fout, "mtllib %s\n", out_material_name.c_str());
            fprintf(fout, "usemtl palette\n");

            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* instance = &scene->instances[instance_index];
                // skip this instance if it's hidden in the .vox file
                if (instance->hidden)
                    continue;
                // skip this instance if it's part of a hidden layer in the .vox file
                if (scene->layers[instance->layer_index].hidden)
                    continue;
                // skip this instance if it's part of a hidden group
                if (instance->group_index != k_invalid_group_index && scene->groups[instance->group_index].hidden)
                    continue;

                ogt_vox_transform transform   = ogt_vox_sample_instance_transform_global(instance, frame_index, scene);
                uint32_t          model_index = ogt_vox_sample_instance_model(instance, frame_index);

                // just in time generate the mesh for this model if we haven't already done so.
                const ogt_vox_model* model = scene->models[model_index];
                if (model && !meshes[model_index]) {
                    // generate a mesh for this model using the mesh_algorithm specified
                    printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n", model->size_x, model->size_y, model->size_z, mesh_algorithm);
                    ogt_mesh* mesh =
                        (strcmp(mesh_algorithm, "polygon") == 0) ? ogt_mesh_from_paletted_voxels_polygon(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "greedy") == 0) ? ogt_mesh_from_paletted_voxels_greedy(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "simple") == 0) ? ogt_mesh_from_paletted_voxels_simple(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        NULL;

                    for (uint32_t i = 0; i < mesh->vertex_count; i++) {
                        // pre-bias the mesh vertices by the model dimensions - resets the center/pivot so it is at (0,0,0)
                        mesh->vertices[i].pos.x -= (float)(model->size_x / 2);
                        mesh->vertices[i].pos.y -= (float)(model->size_y / 2);
                        mesh->vertices[i].pos.z -= (float)(model->size_z / 2);
                        // the normal is always a unit vector aligned on one of the 6 cardinal directions, here we just
                        // precompute which index it was (same order as the 'vn' tags we wrote out when opening the file)
                        // and write it as a uint32_t into the x field. This allows us to avoid do this index conversion
                        // for every vert in a mesh, and not for every vert multiplied by the number of instances.
                        ogt_mesh_vec3& normal = mesh->vertices[i].normal;
                        uint32_t normal_index = normal.x != 0 ? (normal.x > 0.0f ? 0 : 1) :
                                                normal.y != 0 ? (normal.y > 0.0f ? 2 : 3) :
                                                (normal.z > 0.0f ? 4 : 5);
                        *(uint32_t*)&normal.x = normal_index;
                    }
                    // cache this mesh so we don't need to do it multiple times.
                    meshes[model_index] = mesh;
                }

                // some instances can have no geometry, so we just skip em
                const ogt_mesh* mesh = meshes[model_index];
                if (!mesh)
                    continue;

                if (voxel_scale != 1.0f) {
                    // bake voxel scale into the transform to avoid doing the scale per vertex.
                    float* transform_data = &transform.m00;
                    for (size_t i = 0; i < 16; i++) {
                        transform_data[i] *= voxel_scale;
                    }
                    // scaling vertex positions, so we do floating point writes
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %f %f %f\n", pos.x, pos.y, pos.z);
                    }
                }
                else {
                    // we're not scaling positions, can write them much more compactly (smaller .obj file size) as int.
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %i %i %i\n", (int32_t)pos.x, (int32_t)pos.y, (int32_t)pos.z);
                    }
                }
                // write faces
                for (size_t i = 0; i < mesh->index_count; i += 3) {
                    uint32_t v_i0 = base_vertex_index + mesh->indices[i + 0] + 1;
                    uint32_t v_i1 = base_vertex_index + mesh->indices[i + 1] + 1;
                    uint32_t v_i2 = base_vertex_index + mesh->indices[i + 2] + 1;
                    uint32_t t_i0 = mesh->vertices[mesh->indices[i+0]].color.a + 1;
                    uint32_t t_i1 = mesh->vertices[mesh->indices[i+1]].color.a + 1;
                    uint32_t t_i2 = mesh->vertices[mesh->indices[i+2]].color.a + 1;
                    uint32_t n_i0 = *((uint32_t*)&mesh->vertices[mesh->indices[i+0]].normal.x) + 1;
                    uint32_t n_i1 = *((uint32_t*)&mesh->vertices[mesh->indices[i+1]].normal.x) + 1;
                    uint32_t n_i2 = *((uint32_t*)&mesh->vertices[mesh->indices[i+2]].normal.x) + 1;
                    fprintf(fout, "f %u/%u/%u %u/%u/%u %u/%u/%u\n", v_i0, t_i0, n_i0, v_i1, t_i1, n_i1, v_i2, t_i2, n_i2);
                }
                base_vertex_index += mesh->vertex_count;
            }
        }

        if (fout) {
            fclose(fout);
        }
    }
    return !error;
}